

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O1

BSDFSample * __thiscall
pbrt::DielectricInterfaceBxDF::Sample_f
          (BSDFSample *__return_storage_ptr__,DielectricInterfaceBxDF *this,Vector3f wo,Float uc,
          Point2f *u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  TrowbridgeReitzDistribution *this_00;
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  bool bVar9;
  float fVar10;
  int iVar11;
  long in_FS_OFFSET;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Float FVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar29 [56];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar30;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float cd_1;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  Vector3f VVar52;
  Vector3f local_138;
  float local_12c;
  undefined1 local_128 [16];
  Tuple3<pbrt::Vector3,_float> local_118;
  Tuple3<pbrt::Vector3,_float> local_108;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  float local_b8;
  float local_b4;
  Float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  auVar36._4_60_ = wo._12_60_;
  auVar36._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar23._8_56_ = wo._8_56_;
  auVar23._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_138.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar23._0_16_);
  if ((auVar36._0_4_ != 0.0) || (NAN(auVar36._0_4_))) {
    auVar13 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                         ZEXT416((uint)(this->mfDistrib).alpha_x));
    auVar29 = ZEXT856(auVar13._8_8_);
    local_138.super_Tuple3<pbrt::Vector3,_float>.z = auVar36._0_4_;
    if (0.001 <= auVar13._0_4_) {
      local_128._0_4_ = uc;
      this_00 = &this->mfDistrib;
      VVar52 = TrowbridgeReitzDistribution::Sample_wm(this_00,&local_138,u);
      auVar37._4_60_ = auVar36._4_60_;
      auVar37._0_4_ = VVar52.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar24._0_8_ = VVar52.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar24._8_56_ = auVar29;
      auVar15 = auVar24._0_16_;
      local_118._0_8_ = vmovlps_avx(auVar15);
      auVar13 = vmovshdup_avx(auVar15);
      fVar17 = auVar13._0_4_;
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(local_138.super_Tuple3<pbrt::Vector3,_float>.y *
                                              fVar17)),
                                ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.x),
                                auVar15);
      auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.z
                                               ),auVar37._0_16_);
      fVar12 = auVar13._0_4_ + auVar13._0_4_;
      auVar39._0_12_ = ZEXT812(0);
      auVar39._12_4_ = 0;
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * 0.0)),auVar15,auVar39);
      fVar30 = auVar37._0_4_ + auVar13._0_4_;
      if (fVar30 < 0.0) {
        auVar15._0_8_ = auVar24._0_8_ ^ 0x8000000080000000;
        auVar15._8_4_ = auVar29._0_4_ ^ 0x80000000;
        auVar15._12_4_ = auVar29._4_4_ ^ 0x80000000;
      }
      uVar1 = vcmpss_avx512f(ZEXT416((uint)fVar30),auVar39,1);
      bVar2 = (bool)((byte)uVar1 & 1);
      auVar14._4_12_ = auVar36._4_12_;
      auVar14._0_4_ = (uint)bVar2 * (int)-auVar37._0_4_ + (uint)!bVar2 * (int)auVar37._0_4_;
      auVar13 = vmovshdup_avx(auVar15);
      auVar13 = vfmadd213ss_fma(ZEXT416((uint)(VVar52.super_Tuple3<pbrt::Vector3,_float>.x * fVar12
                                              - local_138.super_Tuple3<pbrt::Vector3,_float>.x)),
                                auVar15,ZEXT416((uint)((fVar17 * fVar12 -
                                                       local_138.super_Tuple3<pbrt::Vector3,_float>.
                                                       y) * auVar13._0_4_)));
      auVar15 = vfmadd231ss_fma(auVar13,ZEXT416((uint)(auVar37._0_4_ * fVar12 -
                                                      local_138.super_Tuple3<pbrt::Vector3,_float>.z
                                                      )),auVar14);
      bVar8 = auVar15._0_4_ < -1.0;
      auVar14 = SUB6416(ZEXT464(0x3f800000),0);
      auVar13 = vminss_avx(auVar14,auVar15);
      fVar12 = (float)((uint)bVar8 * -0x40800000 + (uint)!bVar8 * auVar13._0_4_);
      bVar9 = 0.0 < fVar12;
      auVar13._8_4_ = 0x7fffffff;
      auVar13._0_8_ = 0x7fffffff7fffffff;
      auVar13._12_4_ = 0x7fffffff;
      auVar13 = vandps_avx512vl(auVar15,auVar13);
      uVar1 = vcmpss_avx512f(auVar14,auVar15,1);
      bVar2 = (bool)((byte)uVar1 & 1);
      local_e8._4_12_ = auVar13._4_12_;
      auVar15 = ZEXT416((uint)bVar9 * (int)this->eta + (uint)!bVar9 * (int)(1.0 / this->eta));
      local_e8._0_4_ =
           (uint)bVar9 * (int)fVar12 +
           (uint)!bVar9 *
           ((uint)bVar8 * 0x3f800000 +
           (uint)!bVar8 * ((uint)bVar2 * 0x3f800000 + (uint)!bVar2 * auVar13._0_4_));
      auVar13 = vfnmadd213ss_fma(local_e8,local_e8,auVar14);
      auVar13 = vmaxss_avx(auVar13,auVar39);
      local_118.z = auVar37._0_4_;
      if (auVar13._0_4_ < 0.0) {
        local_f8 = auVar15;
        auVar26._0_4_ = sqrtf(auVar13._0_4_);
        auVar26._4_60_ = extraout_var_00;
        auVar13 = auVar26._0_16_;
        auVar15 = local_f8;
      }
      else {
        auVar13 = vsqrtss_avx(auVar13,auVar13);
      }
      auVar18._0_4_ = auVar13._0_4_ / auVar15._0_4_;
      auVar18._4_12_ = auVar13._4_12_;
      auVar13 = SUB6416(ZEXT464(0x3f800000),0);
      fVar12 = (float)local_128._0_4_;
      if (auVar18._0_4_ < 1.0) {
        auVar13 = vfnmadd213ss_fma(auVar18,auVar18,ZEXT416(0x3f800000));
        auVar13 = vmaxss_avx(auVar13,ZEXT816(0) << 0x40);
        if (auVar13._0_4_ < 0.0) {
          local_f8 = auVar15;
          auVar28._0_4_ = sqrtf(auVar13._0_4_);
          auVar28._4_60_ = extraout_var_02;
          auVar13 = auVar28._0_16_;
          auVar15 = local_f8;
          fVar12 = (float)local_128._0_4_;
        }
        else {
          auVar13 = vsqrtss_avx(auVar13,auVar13);
        }
        auVar14 = vfmsub213ss_fma(local_e8,auVar15,auVar13);
        auVar39 = vfmadd213ss_fma(local_e8,auVar15,auVar13);
        auVar33._0_4_ = auVar14._0_4_ / auVar39._0_4_;
        auVar33._4_12_ = auVar14._4_12_;
        auVar39 = vfnmadd213ss_fma(auVar13,auVar15,local_e8);
        auVar13 = vfmadd213ss_fma(auVar13,auVar15,local_e8);
        fVar30 = auVar39._0_4_ / auVar13._0_4_;
        auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar30 * fVar30)),auVar33,auVar33);
        auVar13 = ZEXT416((uint)(auVar13._0_4_ * 0.5));
      }
      fVar30 = 1.0 - auVar13._0_4_;
      fVar17 = (float)((uint)((byte)sampleFlags & 1) * (int)auVar13._0_4_);
      auVar15 = ZEXT416((uint)fVar30);
      fVar30 = (float)((uint)((sampleFlags & Transmission) != Unset) * (int)fVar30);
      local_d8 = ZEXT416((uint)fVar30);
      if ((((fVar17 != 0.0) || (NAN(fVar17))) || (fVar30 != 0.0)) || (NAN(fVar30))) {
        local_f8._0_4_ = fVar17 + fVar30;
        fVar38 = local_138.super_Tuple3<pbrt::Vector3,_float>.x;
        fVar10 = local_138.super_Tuple3<pbrt::Vector3,_float>.y;
        if (fVar17 / (fVar17 + fVar30) <= fVar12) {
          auVar14 = ZEXT816(0);
          uVar1 = vcmpss_avx512f(auVar14,ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.
                                                       z),1);
          bVar2 = (bool)((byte)uVar1 & 1);
          fVar12 = (float)((uint)bVar2 * (int)this->eta + (uint)!bVar2 * (int)(1.0 / this->eta));
          local_e8 = ZEXT416((uint)fVar12);
          local_108.x = 0.0;
          local_108.y = 0.0;
          local_108.z = 0.0;
          auVar50._8_8_ = 0;
          auVar50._0_4_ = local_118.x;
          auVar50._4_4_ = local_118.y;
          auVar13 = vmovshdup_avx(auVar50);
          auVar13 = vfmadd132ss_fma(auVar13,ZEXT416((uint)(local_138.
                                                           super_Tuple3<pbrt::Vector3,_float>.z *
                                                          local_118.z)),
                                    ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.y));
          auVar39 = vfmsub213ss_fma(ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.z),
                                    ZEXT416((uint)local_118.z),
                                    ZEXT416((uint)(local_138.super_Tuple3<pbrt::Vector3,_float>.z *
                                                  local_118.z)));
          auVar39 = vfmadd231ss_fma(ZEXT416((uint)(auVar39._0_4_ + auVar13._0_4_)),auVar50,
                                    ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.x));
          auVar13 = vfnmadd213ss_fma(auVar39,auVar39,SUB6416(ZEXT464(0x3f800000),0));
          auVar13 = vmaxss_avx(auVar13,auVar14);
          fVar12 = auVar13._0_4_ / (fVar12 * fVar12);
          local_128._0_4_ = fVar12;
          local_98 = auVar15;
          if (fVar12 < 1.0) {
            auVar13 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar12)),auVar14);
            if (auVar13._0_4_ < 0.0) {
              local_12c = local_118.z;
              local_88._0_4_ = auVar39._0_4_;
              local_c8 = auVar50;
              fVar30 = sqrtf(auVar13._0_4_);
              auVar50 = local_c8;
              fVar12 = local_12c;
              fVar17 = (float)local_88._0_4_;
            }
            else {
              auVar13 = vsqrtss_avx(auVar13,auVar13);
              fVar30 = auVar13._0_4_;
              fVar12 = local_118.z;
              fVar17 = auVar39._0_4_;
            }
            fVar38 = local_e8._0_4_;
            fVar30 = fVar17 / fVar38 - fVar30;
            auVar44._8_8_ = 0;
            auVar44._0_4_ = local_138.super_Tuple3<pbrt::Vector3,_float>.x;
            auVar44._4_4_ = local_138.super_Tuple3<pbrt::Vector3,_float>.y;
            auVar20._0_4_ = auVar50._0_4_ * fVar30;
            auVar20._4_4_ = auVar50._4_4_ * fVar30;
            auVar20._8_4_ = auVar50._8_4_ * fVar30;
            auVar20._12_4_ = auVar50._12_4_ * fVar30;
            auVar48._4_4_ = fVar38;
            auVar48._0_4_ = fVar38;
            auVar48._8_4_ = fVar38;
            auVar48._12_4_ = fVar38;
            auVar13 = vdivps_avx(auVar44,auVar48);
            auVar13 = vsubps_avx(auVar20,auVar13);
            local_108.z = fVar12 * fVar30 - local_138.super_Tuple3<pbrt::Vector3,_float>.z / fVar38;
            local_108._0_8_ = vmovlps_avx(auVar13);
          }
          if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
               ::reg == '\0') &&
             (iVar11 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                            ::reg), iVar11 != 0)) {
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)
                       &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::reg,const::{lambda(pbrt::StatsAccumulator&)#3}::StatsAccumulator__,
                       (PixelAccumFunc)0x0);
            __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                 ::reg);
          }
          *(long *)(in_FS_OFFSET + -0x730) = *(long *)(in_FS_OFFSET + -0x730) + 1;
          if (1.0 <= (float)local_128._0_4_) {
            *(long *)(in_FS_OFFSET + -0x738) = *(long *)(in_FS_OFFSET + -0x738) + 1;
          }
          if ((local_138.super_Tuple3<pbrt::Vector3,_float>.z * local_108.z <= 0.0) &&
             ((float)local_128._0_4_ < 1.0)) {
            auVar21._0_12_ = ZEXT812(0);
            auVar21._12_4_ = 0;
            if ((local_108.z != 0.0) || (NAN(local_108.z))) {
              local_12c = local_108.z;
              local_c8._0_4_ = local_138.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar35._8_8_ = 0;
              auVar35._0_4_ = local_118.x;
              auVar35._4_4_ = local_118.y;
              auVar13 = vmovshdup_avx(auVar35);
              auVar13 = vfmadd213ss_fma(auVar13,auVar21,ZEXT416((uint)local_118.z));
              auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ + (local_118.z - local_118.z)))
                                        ,auVar35,auVar21);
              if (auVar13._0_4_ < 0.0) {
                auVar35._0_8_ = local_118._0_8_ ^ 0x8000000080000000;
                auVar35._8_4_ = 0x80000000;
                auVar35._12_4_ = 0x80000000;
              }
              uVar1 = vcmpss_avx512f(auVar13,auVar21,1);
              bVar2 = (bool)((byte)uVar1 & 1);
              local_118.z = (float)((uint)bVar2 * (int)-local_118.z +
                                   (uint)!bVar2 * (int)local_118.z);
              local_48 = ZEXT416((uint)local_118.z);
              local_118._0_8_ = vmovlps_avx(auVar35);
              local_88._0_4_ = local_138.super_Tuple3<pbrt::Vector3,_float>.x;
              local_9c = local_138.super_Tuple3<pbrt::Vector3,_float>.y;
              local_78._0_4_ = local_118.x;
              local_a0 = local_118.y;
              local_a4 = local_108.x;
              local_a8 = local_108.y;
              local_b0 = TrowbridgeReitzDistribution::D(this_00,(Vector3f *)&local_118);
              local_b8 = TrowbridgeReitzDistribution::G(this_00,&local_138,(Vector3f *)&local_108);
              auVar13 = vfmadd231ss_fma(ZEXT416((uint)(local_118.y * local_108.y)),
                                        ZEXT416((uint)local_118.x),ZEXT416((uint)local_108.x));
              local_ac = local_108.z;
              auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)local_108.z),
                                        ZEXT416((uint)local_118.z));
              auVar7._8_4_ = 0x7fffffff;
              auVar7._0_8_ = 0x7fffffff7fffffff;
              auVar7._12_4_ = 0x7fffffff;
              local_68 = vandps_avx512vl(auVar13,auVar7);
              auVar15 = vfmadd231ss_fma(ZEXT416((uint)(local_118.y *
                                                      local_138.super_Tuple3<pbrt::Vector3,_float>.y
                                                      )),ZEXT416((uint)local_118.x),
                                        ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.x
                                               ));
              local_b4 = local_138.super_Tuple3<pbrt::Vector3,_float>.z;
              local_58 = vfmadd231ss_fma(auVar15,ZEXT416((uint)local_138.
                                                               super_Tuple3<pbrt::Vector3,_float>.z)
                                         ,ZEXT416((uint)local_118.z));
              auVar13 = vfmadd132ss_fma(auVar13,local_58,ZEXT416((uint)local_e8._0_4_));
              local_128._0_4_ = local_68._0_4_ / (auVar13._0_4_ * auVar13._0_4_);
              FVar16 = TrowbridgeReitzDistribution::PDF(this_00,&local_138,(Vector3f *)&local_118);
              fVar12 = (FVar16 * (float)local_128._0_4_ * (float)local_d8._0_4_) /
                       (float)local_f8._0_4_;
              if (!NAN(fVar12)) {
                fVar30 = 1.0 / local_e8._0_4_;
                auVar45._8_4_ = 0x7fffffff;
                auVar45._0_8_ = 0x7fffffff7fffffff;
                auVar45._12_4_ = 0x7fffffff;
                auVar13 = vandps_avx(auVar45,local_58);
                auVar15 = vfmadd213ss_fma(ZEXT416((uint)local_a4),ZEXT416((uint)local_78._0_4_),
                                          ZEXT416((uint)(local_a0 * local_a8)));
                auVar15 = vfmadd213ss_fma(ZEXT416((uint)local_12c),local_48,auVar15);
                auVar39 = vfmadd213ss_fma(ZEXT416((uint)local_88._0_4_),
                                          ZEXT416((uint)local_78._0_4_),
                                          ZEXT416((uint)(local_a0 * local_9c)));
                auVar39 = vfmadd213ss_fma(ZEXT416((uint)local_c8._0_4_),local_48,auVar39);
                auVar39 = vfmadd231ss_fma(auVar39,local_e8,auVar15);
                auVar15 = vandps_avx(ZEXT416((uint)(local_b4 * local_ac)),auVar45);
                auVar41._0_4_ =
                     (local_b8 * local_b0 * (float)local_68._0_4_ * auVar13._0_4_) /
                     (auVar39._0_4_ * auVar39._0_4_ * auVar15._0_4_);
                auVar41._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar13 = vandps_avx(auVar41,auVar45);
                fVar30 = (float)((uint)(mode == Radiance) * (int)(fVar30 * fVar30) +
                                (uint)(mode != Radiance) * 0x3f800000) * (float)local_98._0_4_ *
                         auVar13._0_4_;
                (__return_storage_ptr__->f).values.values[0] = fVar30;
                (__return_storage_ptr__->f).values.values[1] = fVar30;
                (__return_storage_ptr__->f).values.values[2] = fVar30;
                (__return_storage_ptr__->f).values.values[3] = fVar30;
                (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = local_108.x;
                (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = local_108.y;
                (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = local_108.z;
                __return_storage_ptr__->pdf = fVar12;
                __return_storage_ptr__->flags = GlossyTransmission;
                return __return_storage_ptr__;
              }
              LogFatal<char_const(&)[12]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bxdfs.h"
                         ,0x17a,"Check failed: %s",(char (*) [12])"!IsNaN(pdf)");
            }
          }
        }
        else {
          auVar40._8_8_ = 0;
          auVar40._0_4_ = local_138.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar40._4_4_ = local_138.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar42._8_8_ = 0;
          auVar42._0_4_ = local_118.x;
          auVar42._4_4_ = local_118.y;
          auVar47._0_4_ = fVar38 * local_118.x;
          auVar47._4_4_ = fVar10 * local_118.y;
          auVar47._8_8_ = 0;
          auVar15 = vmovshdup_avx(auVar47);
          auVar15 = vfmadd231ss_fma(auVar15,auVar40,auVar42);
          auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)local_138.
                                                          super_Tuple3<pbrt::Vector3,_float>.z),
                                    ZEXT416((uint)local_118.z));
          fVar12 = auVar15._0_4_ + auVar15._0_4_;
          auVar43._0_4_ = local_118.x * fVar12;
          auVar43._4_4_ = local_118.y * fVar12;
          auVar43._8_4_ = fVar12 * 0.0;
          auVar43._12_4_ = fVar12 * 0.0;
          auVar15 = vsubps_avx(auVar43,auVar40);
          local_108.z = local_118.z * fVar12 - local_138.super_Tuple3<pbrt::Vector3,_float>.z;
          local_108._0_8_ = vmovlps_avx(auVar15);
          local_e8 = auVar13;
          local_128._0_4_ = fVar17;
          local_128._4_12_ = auVar13._4_12_;
          if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
               ::reg == '\0') &&
             (iVar11 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                            ::reg), iVar11 != 0)) {
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)
                       &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::reg,const::{lambda(pbrt::StatsAccumulator&)#2}::StatsAccumulator__,
                       (PixelAccumFunc)0x0);
            __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                 ::reg);
          }
          *(long *)(in_FS_OFFSET + -0x740) = *(long *)(in_FS_OFFSET + -0x740) + 1;
          auVar13 = vfmadd231ss_fma(ZEXT416((uint)(local_138.super_Tuple3<pbrt::Vector3,_float>.y *
                                                  local_118.y)),
                                    ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.x),
                                    ZEXT416((uint)local_118.x));
          auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)local_138.
                                                          super_Tuple3<pbrt::Vector3,_float>.z),
                                    ZEXT416((uint)local_118.z));
          if (auVar13._0_4_ <= 0.0) {
            *(long *)(in_FS_OFFSET + -0x748) = *(long *)(in_FS_OFFSET + -0x748) + 1;
          }
          else if (0.0 < local_138.super_Tuple3<pbrt::Vector3,_float>.z * local_108.z) {
            FVar16 = TrowbridgeReitzDistribution::PDF(this_00,&local_138,(Vector3f *)&local_118);
            auVar13 = vfmadd231ss_fma(ZEXT416((uint)(local_138.super_Tuple3<pbrt::Vector3,_float>.y
                                                    * local_118.y)),
                                      ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.x),
                                      ZEXT416((uint)local_118.x));
            local_d8 = ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.z);
            auVar13 = vfmadd231ss_fma(auVar13,local_d8,ZEXT416((uint)local_118.z));
            fVar12 = ((FVar16 / (auVar13._0_4_ * 4.0)) * (float)local_128._0_4_) /
                     (float)local_f8._0_4_;
            if (NAN(fVar12)) {
              LogFatal<char_const(&)[12]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bxdfs.h"
                         ,0x150,"Check failed: %s",(char (*) [12])"!IsNaN(pdf)");
            }
            if (((local_138.super_Tuple3<pbrt::Vector3,_float>.z != 0.0) ||
                (NAN(local_138.super_Tuple3<pbrt::Vector3,_float>.z))) &&
               ((local_108.z != 0.0 || (NAN(local_108.z))))) {
              local_128._0_4_ = fVar12;
              local_f8 = ZEXT416((uint)local_108.z);
              local_98._0_4_ = TrowbridgeReitzDistribution::D(this_00,(Vector3f *)&local_118);
              FVar16 = TrowbridgeReitzDistribution::G(this_00,&local_138,(Vector3f *)&local_108);
              auVar34._8_4_ = 0x7fffffff;
              auVar34._0_8_ = 0x7fffffff7fffffff;
              auVar34._12_4_ = 0x7fffffff;
              auVar13 = vandps_avx(auVar34,local_d8);
              auVar15 = vandps_avx(auVar34,local_f8);
              fVar12 = (FVar16 * (float)local_98._0_4_ * (float)local_e8._0_4_) /
                       (auVar13._0_4_ * auVar15._0_4_ * 4.0);
              (__return_storage_ptr__->f).values.values[0] = fVar12;
              (__return_storage_ptr__->f).values.values[1] = fVar12;
              (__return_storage_ptr__->f).values.values[2] = fVar12;
              (__return_storage_ptr__->f).values.values[3] = fVar12;
              (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = local_108.x;
              (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = local_108.y;
              (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = local_108.z;
              __return_storage_ptr__->pdf = (Float)local_128._0_4_;
              __return_storage_ptr__->flags = GlossyReflection;
              return __return_storage_ptr__;
            }
          }
        }
      }
    }
    else {
      bVar8 = auVar36._0_4_ < -1.0;
      auVar15 = auVar36._0_16_;
      auVar39 = SUB6416(ZEXT464(0x3f800000),0);
      auVar13 = vminss_avx(auVar39,auVar15);
      fVar12 = (float)((uint)bVar8 * -0x40800000 + (uint)!bVar8 * auVar13._0_4_);
      bVar9 = 0.0 < fVar12;
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar13 = vandps_avx512vl(auVar15,auVar3);
      uVar1 = vcmpss_avx512f(auVar39,auVar15,1);
      bVar2 = (bool)((byte)uVar1 & 1);
      local_e8._4_12_ = auVar13._4_12_;
      local_f8 = ZEXT416((uint)bVar9 * (int)this->eta + (uint)!bVar9 * (int)(1.0 / this->eta));
      local_e8._0_4_ =
           (uint)bVar9 * (int)fVar12 +
           (uint)!bVar9 *
           ((uint)bVar8 * 0x3f800000 +
           (uint)!bVar8 * ((uint)bVar2 * 0x3f800000 + (uint)!bVar2 * auVar13._0_4_));
      auVar13 = vfnmadd213ss_fma(local_e8,local_e8,auVar39);
      auVar13 = vmaxss_avx(auVar13,ZEXT816(0));
      if (auVar13._0_4_ < 0.0) {
        local_128._0_4_ = uc;
        auVar25._0_4_ = sqrtf(auVar13._0_4_);
        auVar25._4_60_ = extraout_var;
        auVar13 = auVar25._0_16_;
        uc = (Float)local_128._0_4_;
      }
      else {
        auVar13 = vsqrtss_avx(auVar13,auVar13);
      }
      auVar31._0_4_ = auVar13._0_4_ / local_f8._0_4_;
      auVar31._4_12_ = auVar13._4_12_;
      fVar12 = 1.0;
      if (auVar31._0_4_ < 1.0) {
        auVar13 = vfnmadd213ss_fma(auVar31,auVar31,ZEXT416(0x3f800000));
        auVar13 = vmaxss_avx(auVar13,ZEXT816(0) << 0x40);
        if (auVar13._0_4_ < 0.0) {
          local_128._0_4_ = uc;
          auVar27._0_4_ = sqrtf(auVar13._0_4_);
          auVar27._4_60_ = extraout_var_01;
          auVar13 = auVar27._0_16_;
          uc = (Float)local_128._0_4_;
        }
        else {
          auVar13 = vsqrtss_avx(auVar13,auVar13);
        }
        auVar39 = vfmsub213ss_fma(local_e8,local_f8,auVar13);
        auVar15 = vfmadd213ss_fma(local_e8,local_f8,auVar13);
        auVar32._0_4_ = auVar39._0_4_ / auVar15._0_4_;
        auVar32._4_12_ = auVar39._4_12_;
        auVar15 = vfnmadd213ss_fma(auVar13,local_f8,local_e8);
        auVar13 = vfmadd213ss_fma(auVar13,local_f8,local_e8);
        fVar12 = auVar15._0_4_ / auVar13._0_4_;
        auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar12)),auVar32,auVar32);
        fVar12 = auVar13._0_4_ * 0.5;
      }
      fVar30 = (float)((uint)((byte)sampleFlags & 1) * (int)fVar12);
      local_128 = ZEXT416((uint)(1.0 - fVar12));
      fVar17 = (float)((uint)((sampleFlags & Transmission) != Unset) * (int)(1.0 - fVar12));
      local_f8 = ZEXT416((uint)fVar17);
      if (((fVar30 != 0.0) || (fVar17 != 0.0)) || (NAN(fVar17))) {
        local_e8._0_4_ = fVar30 + fVar17;
        fVar30 = fVar30 / (fVar30 + fVar17);
        if (uc < fVar30) {
          auVar4._8_4_ = 0x7fffffff;
          auVar4._0_8_ = 0x7fffffff7fffffff;
          auVar4._12_4_ = 0x7fffffff;
          auVar13 = vandps_avx512vl(ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.z),
                                    auVar4);
          fVar12 = fVar12 / auVar13._0_4_;
          (__return_storage_ptr__->f).values.values[0] = fVar12;
          (__return_storage_ptr__->f).values.values[1] = fVar12;
          (__return_storage_ptr__->f).values.values[2] = fVar12;
          (__return_storage_ptr__->f).values.values[3] = fVar12;
          auVar19._8_8_ = 0;
          auVar19._0_4_ = local_138.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar19._4_4_ = local_138.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar5._8_4_ = 0x80000000;
          auVar5._0_8_ = 0x8000000080000000;
          auVar5._12_4_ = 0x80000000;
          auVar13 = vxorps_avx512vl(auVar19,auVar5);
          uVar1 = vmovlps_avx(auVar13);
          (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
          (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)uVar1 >> 0x20);
          (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z =
               local_138.super_Tuple3<pbrt::Vector3,_float>.z;
          __return_storage_ptr__->pdf = fVar30;
          __return_storage_ptr__->flags = SpecularReflection;
          return __return_storage_ptr__;
        }
        auVar15 = ZEXT816(0);
        uVar1 = vcmpss_avx512f(auVar15,ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.z)
                               ,1);
        bVar2 = (bool)((byte)uVar1 & 1);
        fVar12 = (float)((uint)bVar2 * (int)this->eta + (uint)!bVar2 * (int)(1.0 / this->eta));
        local_d8 = ZEXT416((uint)fVar12);
        auVar13 = vfmadd213ss_fma(ZEXT816(0),
                                  ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.y),
                                  ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.z));
        auVar13 = vfmadd231ss_fma(ZEXT416((uint)((local_138.super_Tuple3<pbrt::Vector3,_float>.z -
                                                 local_138.super_Tuple3<pbrt::Vector3,_float>.z) +
                                                auVar13._0_4_)),
                                  ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.x),
                                  auVar15);
        local_c8._0_12_ = ZEXT812(0);
        local_c8._12_4_ = 0;
        if (auVar13._0_4_ < 0.0) {
          auVar51._8_4_ = 0x80000000;
          auVar51._0_8_ = 0x8000000080000000;
          auVar51._12_4_ = 0x80000000;
        }
        else {
          auVar51 = ZEXT816(0) << 0x40;
        }
        auVar39 = vmovshdup_avx(auVar51);
        uVar1 = vcmpss_avx512f(auVar13,auVar15,1);
        bVar2 = (bool)((byte)uVar1 & 1);
        fVar30 = (float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * 0x3f800000);
        auVar13 = vfmadd213ss_fma(ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.y),
                                  auVar39,ZEXT416((uint)(fVar30 * local_138.
                                                                  super_Tuple3<pbrt::Vector3,_float>
                                                                  .z)));
        auVar39 = vfmsub213ss_fma(ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.z),
                                  ZEXT416((uint)fVar30),
                                  ZEXT416((uint)(fVar30 * local_138.
                                                          super_Tuple3<pbrt::Vector3,_float>.z)));
        auVar39 = vfmadd213ss_fma(ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.x),
                                  auVar51,ZEXT416((uint)(auVar13._0_4_ + auVar39._0_4_)));
        auVar13 = vfnmadd213ss_fma(auVar39,auVar39,SUB6416(ZEXT464(0x3f800000),0));
        auVar13 = vmaxss_avx(auVar13,auVar15);
        local_12c = fVar12 * fVar12;
        local_98._0_4_ = auVar13._0_4_ / local_12c;
        auVar13 = ZEXT816(0) << 0x20;
        if ((float)local_98._0_4_ < 1.0) {
          auVar13 = vmaxss_avx(ZEXT416((uint)(1.0 - (float)local_98._0_4_)),ZEXT816(0) << 0x20);
          if (auVar13._0_4_ < 0.0) {
            local_c8._4_8_ = local_c8._4_8_;
            local_c8._0_4_ = auVar39._0_4_;
            local_c8._12_4_ = 0;
            local_88 = auVar51;
            local_78 = ZEXT416((uint)fVar30);
            fVar17 = sqrtf(auVar13._0_4_);
            fVar30 = (float)local_78._0_4_;
            auVar51 = local_88;
          }
          else {
            auVar13 = vsqrtss_avx(auVar13,auVar13);
            fVar17 = auVar13._0_4_;
            local_d8._0_4_ = fVar12;
            local_c8._0_4_ = auVar39._0_4_;
          }
          fVar17 = (float)local_c8._0_4_ / (float)local_d8._0_4_ - fVar17;
          auVar46._8_8_ = 0;
          auVar46._0_4_ = local_138.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar46._4_4_ = local_138.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar22._0_4_ = auVar51._0_4_ * fVar17;
          auVar22._4_4_ = auVar51._4_4_ * fVar17;
          auVar22._8_4_ = auVar51._8_4_ * fVar17;
          auVar22._12_4_ = auVar51._12_4_ * fVar17;
          auVar49._4_4_ = local_d8._0_4_;
          auVar49._0_4_ = local_d8._0_4_;
          auVar49._8_4_ = local_d8._0_4_;
          auVar49._12_4_ = local_d8._0_4_;
          auVar13 = vdivps_avx(auVar46,auVar49);
          local_c8 = vsubps_avx(auVar22,auVar13);
          auVar13 = ZEXT416((uint)(fVar30 * fVar17 -
                                  local_138.super_Tuple3<pbrt::Vector3,_float>.z /
                                  (float)local_d8._0_4_));
        }
        local_d8 = auVar13;
        if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
             ::reg == '\0') &&
           (iVar11 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                          ::reg), iVar11 != 0)) {
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)
                     &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                      ::reg,const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                     (PixelAccumFunc)0x0);
          __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                               ::reg);
        }
        *(long *)(in_FS_OFFSET + -0x750) = *(long *)(in_FS_OFFSET + -0x750) + 1;
        if ((float)local_98._0_4_ < 1.0) {
          auVar6._8_4_ = 0x7fffffff;
          auVar6._0_8_ = 0x7fffffff7fffffff;
          auVar6._12_4_ = 0x7fffffff;
          auVar13 = vandps_avx512vl(local_d8,auVar6);
          local_128._0_4_ = (float)local_128._0_4_ / auVar13._0_4_;
          if (mode == Radiance) {
            local_128._0_4_ = (float)local_128._0_4_ / local_12c;
          }
          (__return_storage_ptr__->f).values.values[0] = (float)local_128._0_4_;
          (__return_storage_ptr__->f).values.values[1] = (float)local_128._0_4_;
          (__return_storage_ptr__->f).values.values[2] = (float)local_128._0_4_;
          (__return_storage_ptr__->f).values.values[3] = (float)local_128._0_4_;
          uVar1 = vmovlps_avx(local_c8);
          (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
          (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)uVar1 >> 0x20);
          (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = (float)local_d8._0_4_;
          __return_storage_ptr__->pdf = (float)local_f8._0_4_ / (float)local_e8._0_4_;
          __return_storage_ptr__->flags = SpecularTransmission;
          return __return_storage_ptr__;
        }
        *(long *)(in_FS_OFFSET + -0x758) = *(long *)(in_FS_OFFSET + -0x758) + 1;
      }
    }
  }
  (__return_storage_ptr__->f).values.values[0] = 0.0;
  (__return_storage_ptr__->f).values.values[1] = 0.0;
  (__return_storage_ptr__->f).values.values[2] = 0.0;
  (__return_storage_ptr__->f).values.values[3] = 0.0;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  __return_storage_ptr__->flags = Unset;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    BSDFSample Sample_f(Vector3f wo, Float uc, const Point2f &u, TransportMode mode,
                        BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        if (wo.z == 0)
            return {};

        if (mfDistrib.EffectivelySpecular()) {
            // Sample delta dielectric interface
            Float R = FrDielectric(CosTheta(wo), eta), T = 1 - R;
            // Compute probabilities _pr_ and _pt_ for sampling reflection and
            // transmission
            Float pr = R, pt = T;
            if (!(sampleFlags & BxDFReflTransFlags::Reflection))
                pr = 0;
            if (!(sampleFlags & BxDFReflTransFlags::Transmission))
                pt = 0;
            if (pr == 0 && pt == 0)
                return {};

            if (uc < pr / (pr + pt)) {
                // Sample perfect specular reflection at interface
                Vector3f wi(-wo.x, -wo.y, wo.z);
                SampledSpectrum fr(R / AbsCosTheta(wi));
                return BSDFSample(fr, wi, pr / (pr + pt), BxDFFlags::SpecularReflection);

            } else {
                // Sample perfect specular transmission at interface
                // Figure out which $\eta$ is incident and which is transmitted
                bool entering = CosTheta(wo) > 0;
                Float etap = entering ? eta : (1 / eta);

                // Compute ray direction for specular transmission
                Vector3f wi;
                bool tir = !Refract(wo, FaceForward(Normal3f(0, 0, 1), wo), etap, &wi);
                CHECK_RARE(1e-6, tir);
                if (tir)
                    return {};

                SampledSpectrum ft(T / AbsCosTheta(wi));
                // Account for non-symmetry with transmission to different medium
                if (mode == TransportMode::Radiance)
                    ft /= Sqr(etap);

                return BSDFSample(ft, wi, pt / (pr + pt),
                                  BxDFFlags::SpecularTransmission);
            }

        } else {
            // Sample non-delta dielectric interface
            // Sample half-angle vector for outgoing direction and compute Frensel factor
            Vector3f wh = mfDistrib.Sample_wm(wo, u);
            Float F = FrDielectric(
                Dot(Reflect(wo, wh), FaceForward(wh, Vector3f(0, 0, 1))), eta);
            Float R = F, T = 1 - R;

            // Compute probabilities _pr_ and _pt_ for sampling reflection and
            // transmission
            Float pr = R, pt = T;
            if (!(sampleFlags & BxDFReflTransFlags::Reflection))
                pr = 0;
            if (!(sampleFlags & BxDFReflTransFlags::Transmission))
                pt = 0;
            if (pr == 0 && pt == 0)
                return {};

            if (uc < pr / (pr + pt)) {
                // Sample reflection at non-delta dielectric interface
                Vector3f wi = Reflect(wo, wh);
                CHECK_RARE(1e-6, Dot(wo, wh) <= 0);
                if (!SameHemisphere(wo, wi) || Dot(wo, wh) <= 0)
                    return {};

                // Compute PDF of _wi_ for microfacet reflection
                Float pdf = mfDistrib.PDF(wo, wh) / (4 * Dot(wo, wh)) * pr / (pr + pt);
                CHECK(!IsNaN(pdf));

                // TODO: reuse fragments from f()
                Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
                // Handle degenerate cases for microfacet reflection
                if (cosTheta_i == 0 || cosTheta_o == 0)
                    return {};
                SampledSpectrum f(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F /
                                  (4 * cosTheta_i * cosTheta_o));
                return BSDFSample(f, wi, pdf, BxDFFlags::GlossyReflection);

            } else {
                // Sample transmission at non-delta dielectric interface
                // FIXME (make consistent): this etap is 1/etap as used in
                // specular...
                Float etap = CosTheta(wo) > 0 ? eta : (1 / eta);
                Vector3f wi;
                bool tir = !Refract(wo, (Normal3f)wh, etap, &wi);
                CHECK_RARE(1e-6, tir);
                if (SameHemisphere(wo, wi))
                    return {};
                if (tir || wi.z == 0)
                    return {};

                // Evaluate BSDF
                // TODO: share fragments with f(), PDF()...
                wh = FaceForward(wh, Normal3f(0, 0, 1));

                Float sqrtDenom = Dot(wo, wh) + etap * Dot(wi, wh);
                Float factor = (mode == TransportMode::Radiance) ? Sqr(1 / etap) : 1;

                SampledSpectrum f(
                    (1 - F) * factor *
                    std::abs(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * AbsDot(wi, wh) *
                             AbsDot(wo, wh) /
                             (AbsCosTheta(wi) * AbsCosTheta(wo) * Sqr(sqrtDenom))));

                // Compute PDF
                Float dwh_dwi =
                    /*Sqr(etap) * */ AbsDot(wi, wh) /
                    Sqr(Dot(wo, wh) + etap * Dot(wi, wh));
                Float pdf = mfDistrib.PDF(wo, wh) * dwh_dwi * pt / (pr + pt);
                CHECK(!IsNaN(pdf));

                return BSDFSample(f, wi, pdf, BxDFFlags::GlossyTransmission);
            }
        }
    }